

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall
CLI::App::_parse_positional
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool haltOnSubcommand)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  size_t sVar5;
  pointer pOVar6;
  ulong uVar7;
  element_type *peVar8;
  App *name;
  size_type sVar9;
  vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *pvVar10;
  undefined8 uVar11;
  byte in_DL;
  App *in_RSI;
  App *in_RDI;
  App *parent_app;
  App *com;
  shared_ptr<CLI::App> *subc;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range1;
  string pos_1;
  Option_p *opt_1;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2;
  string pos;
  Option_p *opt;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range3;
  size_t remreq;
  size_type arg_rem;
  Option *posOpt;
  string *positional;
  string *in_stack_fffffffffffffdc8;
  Option *in_stack_fffffffffffffdd0;
  value_type *in_stack_fffffffffffffdd8;
  vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *in_stack_fffffffffffffde0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffde8;
  App *in_stack_fffffffffffffdf0;
  size_t in_stack_fffffffffffffdf8;
  App *in_stack_fffffffffffffe00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe18;
  App *in_stack_fffffffffffffe20;
  App *in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  Option *in_stack_fffffffffffffe70;
  App *in_stack_fffffffffffffe80;
  ExtrasError *in_stack_fffffffffffffe90;
  __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
  local_160;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *local_158;
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  reference local_d0;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_c8;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_c0;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *local_b8;
  int local_b0;
  string local_a0 [32];
  string local_80 [32];
  reference local_60;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_58;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_50;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *local_48;
  size_t local_40;
  ulong local_38;
  pointer local_30;
  undefined1 haltOnSubcommand_00;
  undefined7 in_stack_ffffffffffffffe0;
  bool local_1;
  
  bVar1 = in_DL & 1;
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffdd0);
  local_30 = (pointer)0x0;
  if ((in_RDI->positionals_at_end_ & 1U) != 0) {
    local_38 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_RSI);
    local_40 = _count_remaining_positionals
                         (in_stack_fffffffffffffe00,SUB81(in_stack_fffffffffffffdf8 >> 0x38,0));
    if (local_38 <= local_40) {
      local_48 = &in_RDI->options_;
      local_50._M_current =
           (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
           std::
           vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ::begin((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                    *)in_stack_fffffffffffffdc8);
      local_58 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                 std::
                 vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                 ::end((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                        *)in_stack_fffffffffffffdc8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                 *)in_stack_fffffffffffffdd0,
                                (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                 *)in_stack_fffffffffffffdc8), bVar2) {
        local_60 = __gnu_cxx::
                   __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                   ::operator*(&local_50);
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16c890);
        bVar2 = Option::get_positional((Option *)0x16c898);
        if ((bVar2) &&
           (pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                               ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                                0x16c8ae),
           ((pOVar6->super_OptionBase<CLI::Option>).required_ & 1U) != 0)) {
          std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                    ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16c8c5);
          sVar5 = Option::count((Option *)0x16c8cd);
          in_stack_fffffffffffffe54 = (int)sVar5;
          pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16c8e1
                             );
          iVar3 = Option::get_items_expected_min(pOVar6);
          if (in_stack_fffffffffffffe54 < iVar3) {
            if ((in_RDI->validate_positionals_ & 1U) != 0) {
              in_stack_fffffffffffffe48 = local_80;
              ::std::__cxx11::string::string(in_stack_fffffffffffffe48,(string *)pvVar4);
              std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                        ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16c939);
              Option::_validate((Option *)in_RDI,
                                (string *)
                                CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                (int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
              ::std::__cxx11::string::operator=(local_80,local_a0);
              ::std::__cxx11::string::~string(local_a0);
              uVar7 = ::std::__cxx11::string::empty();
              if ((uVar7 & 1) == 0) {
                local_b0 = 3;
              }
              else {
                local_b0 = 0;
              }
              ::std::__cxx11::string::~string(local_80);
              if (local_b0 != 0) goto LAB_0016c9ff;
            }
            local_30 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                                 ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                                  in_stack_fffffffffffffdd0);
            break;
          }
        }
LAB_0016c9ff:
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
        ::operator++(&local_50);
      }
    }
  }
  if (local_30 == (pointer)0x0) {
    local_b8 = &in_RDI->options_;
    local_c0._M_current =
         (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
         std::
         vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
         ::begin((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                  *)in_stack_fffffffffffffdc8);
    local_c8 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
               std::
               vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
               ::end((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                      *)in_stack_fffffffffffffdc8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                               *)in_stack_fffffffffffffdd0,
                              (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                               *)in_stack_fffffffffffffdc8), bVar2) {
      local_d0 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                 ::operator*(&local_c0);
      std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16caa4);
      bVar2 = Option::get_positional((Option *)0x16caac);
      if (bVar2) {
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16cac2);
        sVar5 = Option::count((Option *)0x16caca);
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16cadb);
        iVar3 = Option::get_items_expected_max(in_stack_fffffffffffffdd0);
        if (iVar3 <= (int)sVar5) {
          pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16cafa
                             );
          bVar2 = Option::get_allow_extra_args(pOVar6);
          if (!bVar2) goto LAB_0016cc08;
        }
        if ((in_RDI->validate_positionals_ & 1U) != 0) {
          ::std::__cxx11::string::string(local_f0,(string *)pvVar4);
          std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                    ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16cb47);
          Option::_validate((Option *)in_RDI,
                            (string *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                            (int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
          ::std::__cxx11::string::operator=(local_f0,local_110);
          ::std::__cxx11::string::~string(local_110);
          uVar7 = ::std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            local_b0 = 5;
          }
          else {
            local_b0 = 0;
          }
          ::std::__cxx11::string::~string(local_f0);
          if (local_b0 != 0) goto LAB_0016cc08;
        }
        local_30 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                             ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                              in_stack_fffffffffffffdd0);
        break;
      }
LAB_0016cc08:
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
      ::operator++(&local_c0);
    }
  }
  if (local_30 != (pointer)0x0) {
    std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    bVar2 = Option::get_inject_separator(local_30);
    if (bVar2) {
      Option::results_abi_cxx11_(local_30);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffde0);
      if (!bVar2) {
        Option::results_abi_cxx11_(local_30);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffdd0);
        uVar7 = ::std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          ::std::__cxx11::string::string(local_130);
          Option::add_result(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
          ::std::__cxx11::string::~string(local_130);
        }
      }
    }
    bVar2 = Option::get_trigger_on_parse(local_30);
    if ((bVar2) && (local_30->current_option_state_ == callback_run)) {
      Option::clear(in_stack_fffffffffffffdd0);
    }
    ::std::__cxx11::string::string(local_150,(string *)pvVar4);
    Option::add_result(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    ::std::__cxx11::string::~string(local_150);
    bVar2 = Option::get_trigger_on_parse(local_30);
    if (bVar2) {
      Option::run_callback(in_stack_fffffffffffffe70);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x16cdcd);
    return true;
  }
  local_158 = &in_RDI->subcommands_;
  local_160._M_current =
       (shared_ptr<CLI::App> *)
       std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::begin
                 ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
                  in_stack_fffffffffffffdc8);
  std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::end
            ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
             in_stack_fffffffffffffdc8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                        *)in_stack_fffffffffffffdd0,
                       (__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                        *)in_stack_fffffffffffffdc8);
    haltOnSubcommand_00 = (undefined1)((ulong)pvVar4 >> 0x38);
    if (!bVar2) break;
    in_stack_fffffffffffffe90 =
         (ExtrasError *)
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
         ::operator*(&local_160);
    std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x16ce5a);
    uVar7 = ::std::__cxx11::string::empty();
    if (((uVar7 & 1) != 0) &&
       (peVar8 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x16ce7c), (peVar8->disabled_ & 1U) == 0)) {
      std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x16ce8f
                );
      bVar2 = _parse_positional(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                                SUB81((ulong)pvVar4 >> 0x38,0));
      if (bVar2) {
        peVar8 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x16ceb4);
        if ((peVar8->pre_parse_called_ & 1U) == 0) {
          std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x16cec7);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_RSI);
          _trigger_pre_parse(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        }
        return true;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&local_160);
  }
  if ((in_RDI->parent_ != (App *)0x0) && ((in_RDI->fallthrough_ & 1U) != 0)) {
    _get_fallthrough_parent(in_stack_fffffffffffffe20);
    ::std::function::operator_cast_to_bool((function<void_()> *)0x16cf5c);
    bVar2 = _parse_positional(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                              (bool)haltOnSubcommand_00);
    return bVar2;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffdd0);
  name = _find_subcommand(in_stack_fffffffffffffe28,(string *)in_stack_fffffffffffffe20,
                          SUB81((ulong)in_stack_fffffffffffffe18 >> 0x38,0),
                          SUB81((ulong)in_stack_fffffffffffffe18 >> 0x30,0));
  if (name != (App *)0x0) {
    if (in_RDI->require_subcommand_max_ == 0) {
LAB_0016cff9:
      if ((bVar1 & 1) != 0) {
        return false;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x16d01d);
      _parse(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      return true;
    }
    in_stack_fffffffffffffdf8 = in_RDI->require_subcommand_max_;
    sVar9 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::size(&in_RDI->parsed_subcommands_)
    ;
    if (sVar9 < in_stack_fffffffffffffdf8) goto LAB_0016cff9;
  }
  if ((in_RDI->subcommand_fallthrough_ & 1U) != 0) {
    in_stack_fffffffffffffdf0 = in_RDI;
    if (in_RDI->parent_ != (App *)0x0) {
      in_stack_fffffffffffffdf0 = _get_fallthrough_parent(in_stack_fffffffffffffe20);
    }
    in_stack_fffffffffffffe80 = in_stack_fffffffffffffdf0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffdd0);
    name = _find_subcommand(in_stack_fffffffffffffe28,(string *)in_stack_fffffffffffffe20,
                            SUB81((ulong)in_stack_fffffffffffffe18 >> 0x38,0),
                            SUB81((ulong)in_stack_fffffffffffffe18 >> 0x30,0));
    if (name != (App *)0x0) {
      if (name->parent_->require_subcommand_max_ != 0) {
        in_stack_fffffffffffffde0 =
             (vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)
             name->parent_->require_subcommand_max_;
        pvVar10 = (vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)
                  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::size
                            (&name->parent_->parsed_subcommands_);
        if (in_stack_fffffffffffffde0 <= pvVar10) goto LAB_0016d142;
      }
      return false;
    }
  }
LAB_0016d142:
  if ((in_RDI->positionals_at_end_ & 1U) == 0) {
    if ((in_RDI->parent_ == (App *)0x0) ||
       (uVar7 = ::std::__cxx11::string::empty(), (uVar7 & 1) == 0)) {
      _move_to_missing(in_stack_fffffffffffffe00,(Classifier)(in_stack_fffffffffffffdf8 >> 0x20),
                       (string *)in_stack_fffffffffffffdf0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x16d283);
      if ((in_RDI->prefix_command_ & 1U) != 0) {
        while (bVar2 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_fffffffffffffde0), ((bVar2 ^ 0xffU) & 1) != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffdd0);
          _move_to_missing(in_stack_fffffffffffffe00,(Classifier)(in_stack_fffffffffffffdf8 >> 0x20)
                           ,(string *)in_stack_fffffffffffffdf0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x16d2d4);
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
    return local_1;
  }
  uVar11 = __cxa_allocate_exception(0x38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  ExtrasError::ExtrasError
            (in_stack_fffffffffffffe90,(string *)name,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffe80);
  __cxa_throw(uVar11,&ExtrasError::typeinfo,ExtrasError::~ExtrasError);
}

Assistant:

CLI11_INLINE bool App::_parse_positional(std::vector<std::string> &args, bool haltOnSubcommand) {

    const std::string &positional = args.back();
    Option *posOpt{nullptr};

    if(positionals_at_end_) {
        // deal with the case of required arguments at the end which should take precedence over other arguments
        auto arg_rem = args.size();
        auto remreq = _count_remaining_positionals(true);
        if(arg_rem <= remreq) {
            for(const Option_p &opt : options_) {
                if(opt->get_positional() && opt->required_) {
                    if(static_cast<int>(opt->count()) < opt->get_items_expected_min()) {
                        if(validate_positionals_) {
                            std::string pos = positional;
                            pos = opt->_validate(pos, 0);
                            if(!pos.empty()) {
                                continue;
                            }
                        }
                        posOpt = opt.get();
                        break;
                    }
                }
            }
        }
    }
    if(posOpt == nullptr) {
        for(const Option_p &opt : options_) {
            // Eat options, one by one, until done
            if(opt->get_positional() &&
               (static_cast<int>(opt->count()) < opt->get_items_expected_max() || opt->get_allow_extra_args())) {
                if(validate_positionals_) {
                    std::string pos = positional;
                    pos = opt->_validate(pos, 0);
                    if(!pos.empty()) {
                        continue;
                    }
                }
                posOpt = opt.get();
                break;
            }
        }
    }
    if(posOpt != nullptr) {
        parse_order_.push_back(posOpt);
        if(posOpt->get_inject_separator()) {
            if(!posOpt->results().empty() && !posOpt->results().back().empty()) {
                posOpt->add_result(std::string{});
            }
        }
        if(posOpt->get_trigger_on_parse() && posOpt->current_option_state_ == Option::option_state::callback_run) {
            posOpt->clear();
        }
        posOpt->add_result(positional);
        if(posOpt->get_trigger_on_parse()) {
            posOpt->run_callback();
        }

        args.pop_back();
        return true;
    }

    for(auto &subc : subcommands_) {
        if((subc->name_.empty()) && (!subc->disabled_)) {
            if(subc->_parse_positional(args, false)) {
                if(!subc->pre_parse_called_) {
                    subc->_trigger_pre_parse(args.size());
                }
                return true;
            }
        }
    }
    // let the parent deal with it if possible
    if(parent_ != nullptr && fallthrough_) {
        return _get_fallthrough_parent()->_parse_positional(args, static_cast<bool>(parse_complete_callback_));
    }
    /// Try to find a local subcommand that is repeated
    auto *com = _find_subcommand(args.back(), true, false);
    if(com != nullptr && (require_subcommand_max_ == 0 || require_subcommand_max_ > parsed_subcommands_.size())) {
        if(haltOnSubcommand) {
            return false;
        }
        args.pop_back();
        com->_parse(args);
        return true;
    }
    if(subcommand_fallthrough_) {
        /// now try one last gasp at subcommands that have been executed before, go to root app and try to find a
        /// subcommand in a broader way, if one exists let the parent deal with it
        auto *parent_app = (parent_ != nullptr) ? _get_fallthrough_parent() : this;
        com = parent_app->_find_subcommand(args.back(), true, false);
        if(com != nullptr && (com->parent_->require_subcommand_max_ == 0 ||
                              com->parent_->require_subcommand_max_ > com->parent_->parsed_subcommands_.size())) {
            return false;
        }
    }
    if(positionals_at_end_) {
        throw CLI::ExtrasError(name_, args);
    }
    /// If this is an option group don't deal with it
    if(parent_ != nullptr && name_.empty()) {
        return false;
    }
    /// We are out of other options this goes to missing
    _move_to_missing(detail::Classifier::NONE, positional);
    args.pop_back();
    if(prefix_command_) {
        while(!args.empty()) {
            _move_to_missing(detail::Classifier::NONE, args.back());
            args.pop_back();
        }
    }

    return true;
}